

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::send_msg_to_leader
          (raft_server *this,ptr<req_msg> *req,req_ext_params *ext_params)

{
  char cVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _func_int **pp_Var5;
  int iVar6;
  int iVar7;
  iterator iVar8;
  __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar9;
  ptr<cmd_result<ptr<buffer>_>_> pVar10;
  int32 leader_id;
  ptr<auto_fwd_pkg> cur_pkg;
  auto_fwd_req_resp req_resp_pair;
  rpc_handler handler;
  ptr<rpc_client> rpc_cli;
  ptr<buffer> result;
  ptr<raft_params> params;
  ptr<cluster_config> c_conf;
  unique_lock<std::mutex> l;
  thread local_38;
  
  leader_id = *(int *)((long)&req[3].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 4);
  result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (leader_id == -1) {
    p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (*p_Var3->_vptr__Sp_counted_base[7])();
      if (3 < iVar7) {
        p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&req_resp_pair,
                   "return null as leader does not exist in the current group");
        (*p_Var3->_vptr__Sp_counted_base[8])
                  (p_Var3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"send_msg_to_leader",0x77,&req_resp_pair);
        std::__cxx11::string::~string((string *)&req_resp_pair);
      }
    }
    req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,0xfffffffd);
    std::
    make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
              ((shared_ptr<nuraft::buffer> *)this,(cmd_result_code *)&result);
    goto LAB_001a3957;
  }
  if (leader_id ==
      *(int *)&req[3].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi) {
    (**(code **)&(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_msg_base).type_)
              (&handler,req,
               *(undefined8 *)&(ext_params->after_precommit_).super__Function_base._M_functor);
    if (handler.super__Function_base._M_functor._M_unused._M_object == (void *)0x0) {
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar7 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (3 < iVar7) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)&req_resp_pair,"server returns null");
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0x80,&req_resp_pair);
          std::__cxx11::string::~string((string *)&req_resp_pair);
        }
      }
      req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                    0xfffffffc);
      std::
      make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
                ((shared_ptr<nuraft::buffer> *)this,(cmd_result_code *)&result);
    }
    else {
      this->_vptr_raft_server = (_func_int **)0x0;
      (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      if (*(long *)(handler.super__Function_base._M_functor._M_unused._M_function_pointer + 0x68) !=
          0) {
        resp_msg::call_cb((resp_msg *)&req_resp_pair,
                          (ptr<resp_msg> *)handler.super__Function_base._M_functor._M_unused._0_8_);
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&handler,
                   (__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&req_resp_pair);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      if (handler.super__Function_base._M_functor._M_unused._M_function_pointer[0x30] ==
          (_func_void)0x1) {
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&req_resp_pair,
                   (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                   (handler.super__Function_base._M_functor._M_unused._M_function_pointer + 0x38));
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&req_resp_pair);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (*(long *)(handler.super__Function_base._M_functor._M_unused._M_function_pointer + 0x88)
            != 0) {
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
          ::operator()((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                        *)&req_resp_pair);
          std::
          __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)this,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                               *)&req_resp_pair);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&req_resp_pair.req.
                      super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
      }
      if (result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        buffer::pos(result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
      }
      if (this->_vptr_raft_server == (_func_int **)0x0) {
        c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
             handler.super__Function_base._M_functor._M_unused._M_function_pointer[0x30];
        params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
             *(undefined4 *)
              (handler.super__Function_base._M_functor._M_unused._M_function_pointer + 0x98);
        std::
        make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,bool,nuraft::cmd_result_code>
                  ((shared_ptr<nuraft::buffer> *)&req_resp_pair,(bool *)&result,
                   (cmd_result_code *)&c_conf);
        std::
        __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)this,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                             *)&req_resp_pair);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&handler.super__Function_base._M_functor + 8);
  }
  else {
    nuraft::context::get_params((context *)&req_resp_pair);
    cVar1 = *(char *)((long)&((req_resp_pair.req.
                               super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->log_entries_).
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (cVar1 == '\0') {
      req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                    0xfffffffd);
      std::
      make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
                ((shared_ptr<nuraft::buffer> *)this,(cmd_result_code *)&result);
      goto LAB_001a3957;
    }
    nuraft::context::get_params((context *)&params);
    uVar2 = *(uint *)(CONCAT44(params.
                               super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._4_4_,
                               params.
                               super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_4_) + 0x4c);
    iVar7 = *(int *)(CONCAT44(params.
                              super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              params.
                              super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_) + 0x58);
    uVar9 = 1;
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    get_config((raft_server *)&c_conf);
    rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cur_pkg.super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    cur_pkg.super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(req + 0x4b))->__data);
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(req + 0x25),&leader_id);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::make_shared<nuraft::raft_server::auto_fwd_pkg>();
      std::__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&cur_pkg.
                  super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> *)
                 &req_resp_pair);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = &std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(req + 0x25),&leader_id)->
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&cur_pkg.
                          super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                );
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (5 < iVar6) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)&req_resp_pair,
                     "auto forwarding pkg for leader %d not found, created %p",
                     (ulong)(uint)leader_id,
                     cur_pkg.
                     super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbb,&req_resp_pair);
          goto LAB_001a3390;
        }
      }
    }
    else {
      std::__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&cur_pkg.
                  super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
                        ._M_cur + 0x10));
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (5 < iVar6) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)&req_resp_pair,"auto forwarding pkg for leader %d exists %p",
                     (ulong)(uint)leader_id,
                     cur_pkg.
                     super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbf,&req_resp_pair);
LAB_001a3390:
          std::__cxx11::string::~string((string *)&req_resp_pair);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(req + 0x4b));
    while( true ) {
      std::unique_lock<std::mutex>::unique_lock
                (&l,&(cur_pkg.
                      super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->lock_);
      peVar4 = (element_type *)
               ((cur_pkg.
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rpc_client_idle_).
               super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (peVar4 != cur_pkg.
                    super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr) break;
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (5 < iVar6) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)&req_resp_pair,
                     "no connection available, idle %zu, in-use %zu, max %zu",
                     ((cur_pkg.
                       super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->rpc_client_idle_).
                     super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                     ._M_impl._M_node._M_size,
                     ((cur_pkg.
                       super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->rpc_client_in_use_)._M_h._M_element_count,uVar9);
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xce,(string *)&req_resp_pair);
          std::__cxx11::string::~string((string *)&req_resp_pair);
        }
      }
      if (((cur_pkg.
            super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->rpc_client_in_use_)._M_h._M_element_count +
          ((cur_pkg.
            super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->rpc_client_idle_).
          super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
          ._M_impl._M_node._M_size < uVar9) {
        cluster_config::get_server
                  ((cluster_config *)&handler,
                   (int)CONCAT71(c_conf.
                                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._1_7_,
                                 c_conf.
                                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._0_1_));
        pp_Var5 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[4]._vptr__Sp_counted_base;
        (**(code **)(*pp_Var5 + 0x10))
                  (&req_resp_pair,pp_Var5,
                   handler.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
        std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)&req_resp_pair);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__detail::
        _Insert_base<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&(cur_pkg.
                      super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->rpc_client_in_use_,
                 (value_type *)
                 &rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>);
        p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = (*p_Var3->_vptr__Sp_counted_base[7])();
          if (5 < iVar7) {
            p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)&req_resp_pair,"created a new connection %p",
                       rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            (*p_Var3->_vptr__Sp_counted_base[8])
                      (p_Var3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xd6,&req_resp_pair);
            std::__cxx11::string::~string((string *)&req_resp_pair);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&handler.super__Function_base._M_functor + 8));
        goto LAB_001a373f;
      }
      if (iVar7 != 0) {
        req_resp_pair.resp.
        super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        req_resp_pair.resp.
        super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&req_resp_pair,
                   (__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)ext_params);
        std::
        make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                  ();
        std::
        __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&req_resp_pair.resp.
                     super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&handler);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&handler.super__Function_base._M_functor + 8));
        std::mutex::lock((mutex *)&((pthread_mutex_t *)(req + 0x2a))->__data);
        std::__cxx11::
        list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
        ::push_back((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                     *)&req[0x28].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&req_resp_pair);
        p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = (*p_Var3->_vptr__Sp_counted_base[7])();
          if (5 < iVar7) {
            p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)&handler,"reached max connection, put into the queue, %zu elems",
                       req[0x29].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            (*p_Var3->_vptr__Sp_counted_base[8])
                      (p_Var3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xec,&handler);
            std::__cxx11::string::~string((string *)&handler);
          }
        }
        std::
        __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)this,&req_resp_pair.resp.
                                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                      );
        pthread_mutex_unlock((pthread_mutex_t *)(req + 0x2a));
        auto_fwd_req_resp::~auto_fwd_req_resp(&req_resp_pair);
        std::unique_lock<std::mutex>::~unique_lock(&l);
        goto LAB_001a3926;
      }
      std::unique_lock<std::mutex>::unlock(&l);
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (5 < iVar6) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)&req_resp_pair,"reached max connection, wait");
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xdd,(string *)&req_resp_pair);
          std::__cxx11::string::~string((string *)&req_resp_pair);
        }
      }
      EventAwaiter::wait_ms
                (&(cur_pkg.
                   super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->ea_,
                 (long)*(int *)(CONCAT44(params.
                                         super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         params.
                                         super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_) + 0x2c));
      LOCK();
      ((cur_pkg.super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->ea_).status._M_i = idle;
      UNLOCK();
      p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (*p_Var3->_vptr__Sp_counted_base[7])();
        if (5 < iVar6) {
          p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)&req_resp_pair,"wake up, find an available connection");
          (*p_Var3->_vptr__Sp_counted_base[8])
                    (p_Var3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xe0,(string *)&req_resp_pair);
          std::__cxx11::string::~string((string *)&req_resp_pair);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&l);
    }
    std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
               &(peVar4->rpc_client_idle_).
                super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                ._M_impl._M_node._M_size);
    iVar7 = (*(rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_rpc_client[4])();
    if ((char)iVar7 != '\0') {
      cluster_config::get_server
                ((cluster_config *)&req_resp_pair,
                 (int)CONCAT71(c_conf.
                               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._1_7_,
                               c_conf.
                               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_1_));
      pp_Var5 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[4]._vptr__Sp_counted_base;
      (**(code **)(*pp_Var5 + 0x10))
                (&handler,pp_Var5,
                 &((req_resp_pair.req.
                    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_msg_base).term_);
      std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)&handler);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&handler.super__Function_base._M_functor + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req_resp_pair.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__cxx11::
    list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
    ::pop_front(&(cur_pkg.
                  super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->rpc_client_idle_);
    std::__detail::
    _Insert_base<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&(cur_pkg.
                  super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->rpc_client_in_use_,&rpc_cli);
    p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (*p_Var3->_vptr__Sp_counted_base[7])();
      if (5 < iVar7) {
        p_Var3 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&req_resp_pair,"idle connection %p",
                   rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
        (*p_Var3->_vptr__Sp_counted_base[8])
                  (p_Var3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"send_msg_to_leader",0xfb,&req_resp_pair);
        std::__cxx11::string::~string((string *)&req_resp_pair);
      }
    }
LAB_001a373f:
    std::unique_lock<std::mutex>::~unique_lock(&l);
    if (rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::
      make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
                ((shared_ptr<nuraft::buffer> *)this);
    }
    else {
      std::
      make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                ();
      l._M_device = (mutex_type *)auto_fwd_resp_handler;
      l._M_owns = false;
      l._9_7_ = 0;
      local_38._M_id._M_thread = (id)(id)req;
      std::
      _Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
      ::
      _Bind<nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&req_resp_pair,(offset_in_raft_server_to_subr *)&l,(raft_server **)&local_38,
                 (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                  *)this,&cur_pkg,&rpc_cli,(_Placeholder<1> *)&std::placeholders::_1,
                 (_Placeholder<2> *)&std::placeholders::_2);
      std::
      function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                ((function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&handler,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)&req_resp_pair);
      std::
      _Tuple_impl<1UL,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                      *)&req_resp_pair.resp);
      (*(rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_rpc_client[2])
                (rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 ext_params,&handler,
                 (long)*(int *)(CONCAT44(params.
                                         super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         params.
                                         super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_) + 0x5c));
      if (*(int *)(CONCAT44(params.
                            super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,
                            params.
                            super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_4_) + 0x58) == 0) {
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   this->_vptr_raft_server);
      }
      std::_Function_base::~_Function_base(&handler.super__Function_base);
    }
LAB_001a3926:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_pkg.
                super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rpc_cli.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_01 = &params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
LAB_001a3957:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar10.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar10.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar10.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::send_msg_to_leader
                                 ( ptr<req_msg>& req,
                                   const req_ext_params& ext_params )
{
    int32 leader_id = leader_;
    ptr<buffer> result = nullptr;
    if (leader_id == -1) {
        p_in("return null as leader does not exist in the current group");
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    if (leader_id == id_) {
        ptr<resp_msg> resp = process_req(*req, ext_params);
        if (!resp) {
            p_in("server returns null");
            ptr< cmd_result< ptr<buffer> > > ret =
                cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::BAD_REQUEST);
            return ret;
        }

        ptr< cmd_result< ptr<buffer> > > ret = nullptr;
        if (resp->has_cb()) {
            // Blocking mode:
            //   If callback function exists, get new response message
            //   from the callback function.
            resp = resp->call_cb(resp);
        }

        if (resp->get_accepted()) {
            result = resp->get_ctx();

            if (resp->has_async_cb()) {
                // Async handler mode (only when accepted):
                //   Get handler (async_result) from the callback.
                ret = resp->call_async_cb();
            }
        }
        if (result) {
            result->pos(0);
        }

        if (!ret) {
            // In blocking mode,
            // we already have result when we reach here.
            ret = cs_new< cmd_result< ptr<buffer> > >
                  ( result, resp->get_accepted(), resp->get_result_code() );
        }
        return ret;
    }
    if (!ctx_->get_params()->auto_forwarding_) {
        // Auto-forwarding is disabled, return error.
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    // Otherwise: re-direct request to the current leader
    //            (not recommended).
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    ptr<cluster_config> c_conf = get_config();
    ptr<rpc_client> rpc_cli;
    ptr<auto_fwd_pkg> cur_pkg = nullptr;
    {
        auto_lock(rpc_clients_lock_);
        auto entry = auto_fwd_pkgs_.find(leader_id);
        if (entry == auto_fwd_pkgs_.end()) {
            cur_pkg = cs_new<auto_fwd_pkg>();
            auto_fwd_pkgs_[leader_id] = cur_pkg;
            p_tr("auto forwarding pkg for leader %d not found, created %p",
                 leader_id, cur_pkg.get());
        } else {
            cur_pkg = entry->second;
            p_tr("auto forwarding pkg for leader %d exists %p",
                 leader_id, cur_pkg.get());
        }
    }

    // Find available `rpc_cli`.
    do {
        std::unique_lock<std::mutex> l(cur_pkg->lock_);
        // Get an idle connection.
        auto e_rpc = cur_pkg->rpc_client_idle_.begin();
        if (e_rpc == cur_pkg->rpc_client_idle_.end()) {
            // Idle connection doesn't exist,
            // check the total number of connections.
            p_tr( "no connection available, idle %zu, in-use %zu, max %zu",
                   cur_pkg->rpc_client_idle_.size(),
                   cur_pkg->rpc_client_in_use_.size(),
                   max_conns );
            if ( cur_pkg->rpc_client_idle_.size() +
                 cur_pkg->rpc_client_in_use_.size() < max_conns ) {
                // We can create more connections.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
                cur_pkg->rpc_client_in_use_.insert(rpc_cli);
                p_tr("created a new connection %p", rpc_cli.get());

            } else {
                // Already reached the max, wait for idle connection.
                if (is_blocking_mode) {
                    // Blocking mode, sleep here.
                    l.unlock();
                    p_tr("reached max connection, wait");
                    cur_pkg->ea_.wait_ms(params->client_req_timeout_);
                    cur_pkg->ea_.reset();
                    p_tr("wake up, find an available connection");
                    continue;

                } else {
                    // Async mode, put it into the queue, and return immediately.
                    auto_fwd_req_resp req_resp_pair;
                    req_resp_pair.req = req;
                    req_resp_pair.resp = cs_new< cmd_result< ptr<buffer> > >();

                    auto_lock(auto_fwd_reqs_lock_);
                    auto_fwd_reqs_.push_back(req_resp_pair);
                    p_tr("reached max connection, put into the queue, %zu elems",
                         auto_fwd_reqs_.size());
                    return req_resp_pair.resp;
                }
            }
        } else {
            // Put the idle connection to in-use list.
            rpc_cli = *e_rpc;
            if (rpc_cli->is_abandoned()) {
                // Abandoned connection, need to reconnect.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
            }
            cur_pkg->rpc_client_idle_.pop_front();
            cur_pkg->rpc_client_in_use_.insert(rpc_cli);
            p_tr("idle connection %p", rpc_cli.get());
        }
        break;
    } while(true);

    if (!rpc_cli) {
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr< cmd_result< ptr<buffer> > >
        presult( cs_new< cmd_result< ptr<buffer> > >() );

    rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                     this,
                                     presult,
                                     cur_pkg,
                                     rpc_cli,
                                     std::placeholders::_1,
                                     std::placeholders::_2 );
    rpc_cli->send(req, handler, params->auto_forwarding_req_timeout_);

    if (params->return_method_ == raft_params::blocking) {
        presult->get();
    }

    return presult;
}